

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

Type * __thiscall
slang::ast::Compilation::getType
          (Compilation *this,bitwidth_t width,bitmask<slang::ast::IntegralFlags> flags)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong hash;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  byte bVar17;
  try_emplace_args_t local_95;
  uint local_94;
  PackedArrayType *type;
  bitwidth_t width_local;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
  *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  uchar uStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  uchar uStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  uchar uStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator res;
  
  uVar11 = (uint)flags.m_bits << 0x18 | width;
  hash = SUB168(ZEXT416(uVar11) * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(ZEXT416(uVar11) * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar6 = hash >> ((byte)(this->vectorTypeCache).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                         .arrays.groups_size_index & 0x3f);
  local_80 = (table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
              *)&this->vectorTypeCache;
  local_78 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match_word(unsigned_long)::word)[hash & 0xff];
  ppVar3 = (this->vectorTypeCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar4 = (this->vectorTypeCache).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
          .arrays.groups_size_mask;
  uVar9 = 0;
  do {
    pgVar2 = (this->vectorTypeCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar6;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bStack_49 = pgVar2->m[0xf].n;
    uVar14 = (uchar)local_78;
    auVar12[0] = -(local_58 == uVar14);
    uVar15 = (uchar)((uint)local_78 >> 8);
    auVar12[1] = -(uStack_57 == uVar15);
    uVar16 = (uchar)((uint)local_78 >> 0x10);
    auVar12[2] = -(uStack_56 == uVar16);
    bVar17 = (byte)((uint)local_78 >> 0x18);
    auVar12[3] = -(bStack_55 == bVar17);
    auVar12[4] = -(uStack_54 == uVar14);
    auVar12[5] = -(uStack_53 == uVar15);
    auVar12[6] = -(uStack_52 == uVar16);
    auVar12[7] = -(bStack_51 == bVar17);
    auVar12[8] = -(uStack_50 == uVar14);
    auVar12[9] = -(uStack_4f == uVar15);
    auVar12[10] = -(uStack_4e == uVar16);
    auVar12[0xb] = -(bStack_4d == bVar17);
    auVar12[0xc] = -(uStack_4c == uVar14);
    auVar12[0xd] = -(uStack_4b == uVar15);
    auVar12[0xe] = -(uStack_4a == uVar16);
    auVar12[0xf] = -(bStack_49 == bVar17);
    for (uVar10 = (uint)(ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe); uVar10 != 0;
        uVar10 = uVar10 - 1 & uVar10) {
      iVar5 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
        }
      }
      if (uVar11 == *(uint *)((long)&ppVar3[uVar6 * 0xf].first + (ulong)(uint)(iVar5 << 4))) {
        return (Type *)*(PackedArrayType **)
                        ((long)&ppVar3[uVar6 * 0xf].second + (ulong)(uint)(iVar5 << 4));
      }
    }
    bVar17 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7];
    if ((bVar17 & bStack_49) == 0) break;
    lVar7 = uVar6 + uVar9;
    uVar9 = uVar9 + 1;
    uVar6 = lVar7 + 1U & uVar4;
  } while (uVar9 <= uVar4);
  res.pg._0_4_ = width - 1;
  res.pg._4_4_ = 0;
  local_94 = uVar11;
  width_local = width;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  type = BumpAllocator::
         emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange,unsigned_int&>
                   (&this->super_BumpAllocator,this->scalarTypeTable[flags.m_bits & 7],
                    (ConstantRange *)&res,&width_local);
  uVar9 = hash >> ((byte)(this->vectorTypeCache).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                         .arrays.groups_size_index & 0x3f);
  uVar4 = (this->vectorTypeCache).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
          .arrays.groups_size_mask;
  uVar8 = 0;
  uVar6 = uVar9;
  do {
    pgVar2 = (this->vectorTypeCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar6;
    local_68 = pgVar2->m[0].n;
    uStack_67 = pgVar2->m[1].n;
    uStack_66 = pgVar2->m[2].n;
    uStack_65 = pgVar2->m[3].n;
    uStack_64 = pgVar2->m[4].n;
    uStack_63 = pgVar2->m[5].n;
    uStack_62 = pgVar2->m[6].n;
    uStack_61 = pgVar2->m[7].n;
    uStack_60 = pgVar2->m[8].n;
    uStack_5f = pgVar2->m[9].n;
    uStack_5e = pgVar2->m[10].n;
    uStack_5d = pgVar2->m[0xb].n;
    uStack_5c = pgVar2->m[0xc].n;
    uStack_5b = pgVar2->m[0xd].n;
    uStack_5a = pgVar2->m[0xe].n;
    bStack_59 = pgVar2->m[0xf].n;
    auVar13[0] = -(local_68 == (uchar)local_78);
    auVar13[1] = -(uStack_67 == local_78._1_1_);
    auVar13[2] = -(uStack_66 == local_78._2_1_);
    auVar13[3] = -(uStack_65 == local_78._3_1_);
    auVar13[4] = -(uStack_64 == (uchar)uStack_74);
    auVar13[5] = -(uStack_63 == uStack_74._1_1_);
    auVar13[6] = -(uStack_62 == uStack_74._2_1_);
    auVar13[7] = -(uStack_61 == uStack_74._3_1_);
    auVar13[8] = -(uStack_60 == (uchar)uStack_70);
    auVar13[9] = -(uStack_5f == uStack_70._1_1_);
    auVar13[10] = -(uStack_5e == uStack_70._2_1_);
    auVar13[0xb] = -(uStack_5d == uStack_70._3_1_);
    auVar13[0xc] = -(uStack_5c == (uchar)uStack_6c);
    auVar13[0xd] = -(uStack_5b == uStack_6c._1_1_);
    auVar13[0xe] = -(uStack_5a == uStack_6c._2_1_);
    auVar13[0xf] = -(bStack_59 == uStack_6c._3_1_);
    for (uVar10 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe); uVar10 != 0;
        uVar10 = uVar10 - 1 & uVar10) {
      iVar5 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
        }
      }
      if (uVar11 == *(uint *)((long)&(this->vectorTypeCache).table_.
                                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                                     .arrays.elements_[uVar6 * 0xf].first +
                             (ulong)(uint)(iVar5 << 4))) {
        return (Type *)type;
      }
    }
    if ((bVar17 & bStack_59) == 0) break;
    lVar7 = uVar6 + uVar8;
    uVar8 = uVar8 + 1;
    uVar6 = lVar7 + 1U & uVar4;
  } while (uVar8 <= uVar4);
  if ((this->vectorTypeCache).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->vectorTypeCache).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,unsigned_int&,slang::ast::PackedArrayType*&>
              (&res,local_80,(arrays_type *)local_80,uVar9,hash,&local_95,&local_94,&type);
    psVar1 = &(this->vectorTypeCache).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,unsigned_int&,slang::ast::PackedArrayType*&>
              (&res,local_80,hash,&local_95,&local_94,&type);
  }
  return (Type *)type;
}

Assistant:

const Type& Compilation::getType(bitwidth_t width, bitmask<IntegralFlags> flags) {
    SLANG_ASSERT(width > 0 && width <= SVInt::MAX_BITS);
    uint32_t key = width;
    key |= uint32_t(flags.bits()) << SVInt::BITWIDTH_BITS;
    auto it = vectorTypeCache.find(key);
    if (it != vectorTypeCache.end())
        return *it->second;

    SLANG_ASSERT(!isFrozen());

    auto type = emplace<PackedArrayType>(getScalarType(flags), ConstantRange{int32_t(width - 1), 0},
                                         width);
    vectorTypeCache.emplace_hint(it, key, type);
    return *type;
}